

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_options.h
# Opt level: O0

void __thiscall google::protobuf::compiler::csharp::Options::~Options(Options *this)

{
  Options *this_local;
  
  std::__cxx11::string::~string((string *)&this->base_namespace);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Options() :
      file_extension(".cs"),
      base_namespace(""),
      base_namespace_specified(false),
      internal_access(false),
      serializable(false) {
  }